

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

void __thiscall xemmai::t_emit::f_merge(t_emit *this,t_block *a_junction)

{
  pointer ptVar1;
  _Bit_type *p_Var2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  ptVar1 = (a_junction->v_privates).
           super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(a_junction->v_privates).
                super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar1;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 2;
    p_Var2 = (this->v_privates->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar3 = 0;
    do {
      uVar5 = uVar3 + 0x3f;
      if (-1 < (long)uVar3) {
        uVar5 = uVar3;
      }
      lVar6 = (long)uVar5 >> 6;
      uVar7 = (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001);
      uVar5 = 1L << ((byte)uVar3 & 0x3f);
      if (ptVar1[uVar3].v_out == true) {
        uVar5 = uVar5 | p_Var2[lVar6 + uVar7 + 0xffffffffffffffff];
      }
      else {
        uVar5 = ~uVar5 & p_Var2[lVar6 + uVar7 + 0xffffffffffffffff];
      }
      p_Var2[lVar6 + uVar7 + 0xffffffffffffffff] = uVar5;
      uVar3 = uVar3 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != uVar3);
  }
  return;
}

Assistant:

void f_merge(const ast::t_block& a_junction)
	{
		for (size_t i = 0; i < a_junction.v_privates.size(); ++i) (*v_privates)[i] = a_junction.v_privates[i].v_out;
	}